

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

string * cfd::core::DescriptorNode::GenerateChecksum
                   (string *__return_storage_ptr__,string *descriptor)

{
  int j;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *__end;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  
  if (GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GenerateChecksum(std::__cxx11::string_const&)::
                                 kInputCharset_abi_cxx11_);
    if (iVar1 != 0) {
      GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_.field_2
      ;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_,
                 "0123456789()[],\'/*abcdefgh@:$%{}IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~ijklmnopqrstuvwxyzABCDEFGH`#\"\\ "
                 ,"");
      __cxa_atexit(::std::__cxx11::string::~string,
                   &GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_);
    }
  }
  if (GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GenerateChecksum(std::__cxx11::string_const&)::
                                 kChecksumCharset_abi_cxx11_);
    if (iVar1 != 0) {
      GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_.
                     field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_,
                 "qpzry9x8gf2tvdw0s3jn54khce6mua7l","");
      __cxa_atexit(::std::__cxx11::string::~string,
                   &GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GenerateChecksum(std::__cxx11::string_const&)::
                           kChecksumCharset_abi_cxx11_);
    }
  }
  uVar8 = 0;
  bVar12 = descriptor->_M_string_length == 0;
  bVar11 = !bVar12;
  if (bVar12) {
    uVar9 = 1;
    bVar12 = false;
  }
  else {
    iVar1 = 0;
    uVar9 = 1;
    uVar8 = 0;
    iVar10 = 0;
    do {
      uVar2 = ::std::__cxx11::string::find
                        ('\x18',(ulong)(uint)(int)(descriptor->_M_dataplus)._M_p[uVar8]);
      if (uVar2 == 0xffffffffffffffff) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
      else {
        uVar3 = uVar9 >> 0x23;
        uVar7 = (uVar9 & 0x7ffffffff) << 5 | (ulong)((uint)uVar2 & 0x1f);
        uVar4 = uVar7 ^ 0xf5dee51989;
        if ((uVar9 >> 0x23 & 1) == 0) {
          uVar4 = uVar7;
        }
        uVar9 = uVar4 ^ 0xa9fdca3312;
        if ((uVar3 & 2) == 0) {
          uVar9 = uVar4;
        }
        uVar4 = uVar9 ^ 0x1bab10e32d;
        if ((uVar3 & 4) == 0) {
          uVar4 = uVar9;
        }
        uVar7 = uVar4 ^ 0x3706b1677a;
        if ((uVar3 & 8) == 0) {
          uVar7 = uVar4;
        }
        uVar9 = uVar7 ^ 0x644d626ffd;
        if ((uVar3 & 0x10) == 0) {
          uVar9 = uVar7;
        }
        iVar10 = (int)(uVar2 >> 5) + iVar10 * 3;
        iVar1 = iVar1 + 1;
        if (iVar1 == 3) {
          uVar3 = uVar9 >> 0x23;
          uVar7 = (long)iVar10 ^ (uVar9 & 0x7ffffffff) << 5;
          uVar4 = uVar7 ^ 0xf5dee51989;
          if ((uVar9 >> 0x23 & 1) == 0) {
            uVar4 = uVar7;
          }
          uVar9 = uVar4 ^ 0xa9fdca3312;
          if ((uVar3 & 2) == 0) {
            uVar9 = uVar4;
          }
          uVar4 = uVar9 ^ 0x1bab10e32d;
          if ((uVar3 & 4) == 0) {
            uVar4 = uVar9;
          }
          uVar7 = uVar4 ^ 0x3706b1677a;
          if ((uVar3 & 8) == 0) {
            uVar7 = uVar4;
          }
          uVar9 = uVar7 ^ 0x644d626ffd;
          if ((uVar3 & 0x10) == 0) {
            uVar9 = uVar7;
          }
          iVar10 = 0;
          iVar1 = 0;
        }
      }
      if (uVar2 == 0xffffffffffffffff) break;
      uVar8 = uVar8 + 1;
      bVar11 = uVar8 < descriptor->_M_string_length;
    } while (bVar11);
    bVar12 = 0 < iVar1;
    uVar8 = (ulong)iVar10;
  }
  if (!bVar11) {
    if (bVar12) {
      uVar4 = uVar9 >> 0x23;
      uVar8 = (uVar9 & 0x7ffffffff) << 5 ^ uVar8;
      uVar2 = uVar8 ^ 0xf5dee51989;
      if ((uVar9 >> 0x23 & 1) == 0) {
        uVar2 = uVar8;
      }
      uVar8 = uVar2 ^ 0xa9fdca3312;
      if ((uVar4 & 2) == 0) {
        uVar8 = uVar2;
      }
      uVar9 = uVar8 ^ 0x1bab10e32d;
      if ((uVar4 & 4) == 0) {
        uVar9 = uVar8;
      }
      uVar8 = uVar9 ^ 0x3706b1677a;
      if ((uVar4 & 8) == 0) {
        uVar8 = uVar9;
      }
      uVar9 = uVar8 ^ 0x644d626ffd;
      if ((uVar4 & 0x10) == 0) {
        uVar9 = uVar8;
      }
    }
    iVar1 = 8;
    do {
      uVar2 = uVar9 >> 0x23;
      uVar4 = (uVar9 & 0x7ffffffff) << 5;
      uVar8 = uVar4 ^ 0xf5dee51989;
      if ((uVar9 >> 0x23 & 1) == 0) {
        uVar8 = uVar4;
      }
      uVar9 = uVar8 ^ 0xa9fdca3312;
      if ((uVar2 & 2) == 0) {
        uVar9 = uVar8;
      }
      uVar8 = uVar9 ^ 0x1bab10e32d;
      if ((uVar2 & 4) == 0) {
        uVar8 = uVar9;
      }
      uVar4 = uVar8 ^ 0x3706b1677a;
      if ((uVar2 & 8) == 0) {
        uVar4 = uVar8;
      }
      uVar9 = uVar4 ^ 0x644d626ffd;
      if ((uVar2 & 0x10) == 0) {
        uVar9 = uVar4;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\b');
    lVar6 = 0x23;
    lVar5 = 0;
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar5] =
           GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_._M_dataplus.
           _M_p[(uint)((uVar9 ^ 1) >> ((byte)lVar6 & 0x3f)) & 0x1f];
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + -5;
    } while (lVar6 != -5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorNode::GenerateChecksum(const std::string& descriptor) {
  // base
  // bitcoin/src/script/descriptor.cpp
  // std::string DescriptorChecksum(const Span<const char>& span)

  /** A character set designed such that:
   *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
   *  - Case errors cause an offset that's a multiple of 32.
   *  - As many alphabetic characters are in the same group (while following the above restrictions).
   *
   * If p(x) gives the position of a character c in this character set, every group of 3 characters
   * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
   * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
   * affect a single symbol.
   *
   * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
   * the position within the groups.
   */
  static const std::string kInputCharset =
      "0123456789()[],'/*abcdefgh@:$%{}"
      "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
      "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

  /** The character set for the checksum itself (same as bech32). */
  static const std::string kChecksumCharset =
      "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

  static auto poly_mod = [](uint64_t c, int val) -> uint64_t {
    uint8_t c0 = c >> 35;
    c = ((c & 0x7ffffffff) << 5) ^ val;
    if (c0 & 1) c ^= 0xf5dee51989;
    if (c0 & 2) c ^= 0xa9fdca3312;
    if (c0 & 4) c ^= 0x1bab10e32d;
    if (c0 & 8) c ^= 0x3706b1677a;
    if (c0 & 16) c ^= 0x644d626ffd;
    return c;
  };

  uint64_t c = 1;
  int cls = 0;
  int clscount = 0;
  for (size_t idx = 0; idx < descriptor.size(); ++idx) {
    const char& ch = descriptor[idx];
    auto pos = kInputCharset.find(ch);
    if (pos == std::string::npos) return "";
    // Emit a symbol for the position inside the group, for every character.
    c = poly_mod(c, pos & 31);
    // Accumulate the group numbers
    cls = cls * 3 + static_cast<int>(pos >> 5);
    if (++clscount == 3) {
      // NOLINT Emit an extra symbol representing the group numbers, for every 3 characters.
      c = poly_mod(c, cls);
      cls = 0;
      clscount = 0;
    }
  }
  if (clscount > 0) c = poly_mod(c, cls);
  // Shift further to determine the checksum.
  for (int j = 0; j < 8; ++j) c = poly_mod(c, 0);
  // Prevent appending zeroes from not affecting the checksum.
  c ^= 1;

  std::string ret(8, ' ');
  for (int j = 0; j < 8; ++j)
    ret[j] = kChecksumCharset[(c >> (5 * (7 - j))) & 31];

  return ret;
}